

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_exception.hpp
# Opt level: O3

void __thiscall
duckdb::CatalogException::
CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (CatalogException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6_00;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffffec8;
  _Alloc_hider _Var3;
  undefined1 in_stack_fffffffffffffed8 [24];
  _Alloc_hider _Var4;
  undefined1 in_stack_fffffffffffffef8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + params->_M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar1 = (params_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + params_1->_M_string_length);
  _Var4._M_p = &stack0xffffffffffffff00;
  pcVar1 = (params_2->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffef0,pcVar1,pcVar1 + params_2->_M_string_length);
  _Var3._M_p = &stack0xfffffffffffffee0;
  pcVar1 = (params_3->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed0,pcVar1,pcVar1 + params_3->_M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,*(long *)params_4._M_dataplus._M_p,
             *(long *)(params_4._M_dataplus._M_p + 8) + *(long *)params_4._M_dataplus._M_p);
  local_b0[0] = local_a0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,*(long *)params_4._M_string_length,
             *(long *)(params_4._M_string_length + 8) + *(long *)params_4._M_string_length);
  uVar2 = 0xd45e3f;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,*(long *)params_4.field_2._M_allocated_capacity,
             *(long *)(params_4.field_2._M_allocated_capacity + 8) +
             *(long *)params_4.field_2._M_allocated_capacity);
  params_4_00._M_string_length = (size_type)local_70;
  params_4_00._M_dataplus._M_p = (pointer)local_b0;
  params_4_00.field_2._M_allocated_capacity = uVar2;
  params_4_00.field_2._8_8_ = in_stack_fffffffffffffec8;
  params_5_00._M_string_length = in_stack_fffffffffffffed8._0_8_;
  params_5_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffed8._8_16_;
  params_5_00._M_dataplus._M_p = _Var3._M_p;
  params_6_00._M_string_length = in_stack_fffffffffffffef8._0_8_;
  params_6_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffef8._8_16_;
  params_6_00._M_dataplus._M_p = _Var4._M_p;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_50,(Exception *)msg,&local_d0,&local_f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffed0,&local_90,params_4_00,params_5_00,params_6_00);
  CatalogException(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (_Var3._M_p != &stack0xfffffffffffffee0) {
    operator_delete(_Var3._M_p);
  }
  if (_Var4._M_p != &stack0xffffffffffffff00) {
    operator_delete(_Var4._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit CatalogException(const string &msg, ARGS... params) : CatalogException(ConstructMessage(msg, params...)) {
	}